

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::FieldGenerator::FieldGenerator
          (FieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  mapped_type *pmVar7;
  long *plVar8;
  char *pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *descriptor_00;
  Descriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  Descriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  FieldDescriptor *extraout_RDX_09;
  FieldDescriptor *extraout_RDX_10;
  FieldDescriptor *extraout_RDX_11;
  FieldDescriptor *extraout_RDX_12;
  FieldDescriptor *extraout_RDX_13;
  FieldDescriptor *pFVar14;
  bool bVar15;
  size_type __dnew;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  field_flags;
  size_type __dnew_2;
  string raw_field_name;
  size_type __dnew_11;
  string camel_case_name;
  size_type __dnew_1;
  string un_camel_case_name;
  SourceLocation location;
  string local_208;
  key_type local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  key_type local_1a0;
  key_type local_180;
  undefined1 *local_160;
  size_t local_158;
  undefined1 local_150 [16];
  size_type local_140;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  key_type local_d8;
  string local_b8;
  code *local_98 [2];
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this->_vptr_FieldGenerator = (_func_int **)&PTR__SingleFieldGenerator_0046c3a0;
  this->descriptor_ = descriptor;
  this_00 = &this->variables_;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  FieldName_abi_cxx11_(&local_138,(objectivec *)descriptor,(FieldDescriptor *)options);
  local_160 = local_150;
  local_158 = 0;
  local_150[0] = 0;
  if (*(once_flag **)(descriptor + 0x30) != (once_flag *)0x0) {
    local_98[0] = FieldDescriptor::TypeOnceInit;
    local_208._M_dataplus._M_p = (pointer)descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x30),(_func_void_FieldDescriptor_ptr **)local_98,
               (FieldDescriptor **)&local_208);
  }
  if (*(int *)(descriptor + 0x38) == 10) {
    FieldDescriptor::message_type(descriptor);
  }
  std::__cxx11::string::_M_assign((string *)&local_160);
  UnCamelCaseFieldName(&local_b8,&local_138,descriptor);
  bVar15 = true;
  if (local_158 == local_b8._M_string_length) {
    if (local_158 == 0) {
      bVar15 = false;
    }
    else {
      iVar6 = bcmp(local_160,local_b8._M_dataplus._M_p,local_158);
      bVar15 = iVar6 != 0;
    }
  }
  local_88._M_p = (pointer)((long)&((SourceLocation *)local_98)->leading_comments + 0x10);
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&((SourceLocation *)local_98)->trailing_comments + 0x10);
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_p = (pointer)paVar10;
  bVar5 = FieldDescriptor::GetSourceLocation(descriptor,(SourceLocation *)local_98);
  if (bVar5) {
    BuildCommentsString_abi_cxx11_
              (&local_208,(objectivec *)local_98,(SourceLocation *)0x1,SUB81(paVar10,0));
    local_180.field_2._M_allocated_capacity = 0x73746e656d6d6f63;
    local_180._M_string_length = 8;
    local_180.field_2._M_local_buf[8] = '\0';
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_208);
    descriptor_00 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p);
      descriptor_00 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == &local_208.field_2) goto LAB_002e8ee8;
  }
  else {
    local_208.field_2._M_allocated_capacity._0_4_ = 0x6d6d6f63;
    local_208.field_2._M_local_buf[4] = 'e';
    local_208.field_2._M_local_buf[5] = 'n';
    local_208.field_2._M_allocated_capacity._6_2_ = 0x7374;
    local_208._M_string_length = 8;
    local_208.field_2._M_local_buf[8] = '\0';
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_208);
    std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x3990d4);
    descriptor_00 = extraout_RDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == &local_208.field_2) goto LAB_002e8ee8;
  }
  operator_delete(local_208._M_dataplus._M_p);
  descriptor_00 = extraout_RDX_01;
LAB_002e8ee8:
  ClassName_abi_cxx11_(&local_180,*(objectivec **)(descriptor + 0x50),descriptor_00);
  paVar10 = &local_208.field_2;
  local_208.field_2._M_allocated_capacity._0_4_ = 0x73616c63;
  local_208.field_2._M_local_buf[4] = 's';
  local_208.field_2._M_local_buf[5] = 'n';
  local_208.field_2._M_allocated_capacity._6_2_ = 0x6d61;
  local_208.field_2._M_local_buf[8] = 'e';
  local_208.field_2._M_local_buf[9] = '\0';
  local_208._M_string_length = 9;
  local_208._M_dataplus._M_p = (pointer)paVar10;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_208);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  local_208.field_2._M_allocated_capacity._0_4_ = 0x656d616e;
  local_208._M_string_length = 4;
  local_208.field_2._M_local_buf[4] = '\0';
  local_208._M_dataplus._M_p = (pointer)paVar10;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_208);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  pFVar14 = extraout_RDX_02;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
    pFVar14 = extraout_RDX_03;
  }
  FieldNameCapitalized_abi_cxx11_(&local_f8,(objectivec *)descriptor,pFVar14);
  local_1d8._M_dataplus._M_p = (pointer)0x10;
  local_208._M_dataplus._M_p = (pointer)paVar10;
  local_208._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_1d8);
  local_208.field_2._M_allocated_capacity._0_4_ = SUB84(local_1d8._M_dataplus._M_p,0);
  local_208.field_2._M_local_buf[4] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x20);
  local_208.field_2._M_local_buf[5] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x28);
  local_208.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_1d8._M_dataplus._M_p >> 0x30);
  *(undefined8 *)local_208._M_dataplus._M_p = 0x696c617469706163;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 8) = 'z';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 9) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 10) = 'd';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xb) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xc) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xd) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xe) = 'm';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xf) = 'e';
  local_208._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
  local_208._M_dataplus._M_p[(long)local_1d8._M_dataplus._M_p] = '\0';
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_208);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  local_208.field_2._M_allocated_capacity._0_4_ = 0x5f776172;
  local_208.field_2._M_local_buf[4] = 'f';
  local_208.field_2._M_local_buf[5] = 'i';
  local_208.field_2._M_allocated_capacity._6_2_ = 0x6c65;
  local_208.field_2._M_local_buf[8] = 'd';
  local_208.field_2._M_local_buf[9] = '_';
  local_208.field_2._10_4_ = 0x656d616e;
  local_208._M_string_length = 0xe;
  local_208.field_2._M_local_buf[0xe] = '\0';
  local_208._M_dataplus._M_p = (pointer)paVar10;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_208);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  paVar2 = &local_1d8.field_2;
  local_1d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  std::__cxx11::string::append((char *)&local_1d8);
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1d8,(ulong)local_f8._M_dataplus._M_p);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar11) {
    sVar3 = paVar11->_M_allocated_capacity;
    lVar4 = plVar8[3];
    local_208.field_2._M_allocated_capacity._0_4_ = (undefined4)sVar3;
    local_208.field_2._M_local_buf[4] = (char)(sVar3 >> 0x20);
    local_208.field_2._M_local_buf[5] = (char)(sVar3 >> 0x28);
    local_208.field_2._M_allocated_capacity._6_2_ = (undefined2)(sVar3 >> 0x30);
    local_208.field_2._M_local_buf[8] = (char)lVar4;
    local_208.field_2._M_local_buf[9] = (char)((ulong)lVar4 >> 8);
    local_208.field_2._10_4_ = (undefined4)((ulong)lVar4 >> 0x10);
    local_208.field_2._M_local_buf[0xe] = (char)((ulong)lVar4 >> 0x30);
    local_208.field_2._M_local_buf[0xf] = (char)((ulong)lVar4 >> 0x38);
    local_208._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    sVar3 = paVar11->_M_allocated_capacity;
    local_208.field_2._M_allocated_capacity._0_4_ = (undefined4)sVar3;
    local_208.field_2._M_local_buf[4] = (char)(sVar3 >> 0x20);
    local_208.field_2._M_local_buf[5] = (char)(sVar3 >> 0x28);
    local_208.field_2._M_allocated_capacity._6_2_ = (undefined2)(sVar3 >> 0x30);
    local_208._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_208._M_string_length = plVar8[1];
  *plVar8 = (long)paVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  paVar11 = &local_1a0.field_2;
  local_118._M_dataplus._M_p = (pointer)0x11;
  local_1a0._M_dataplus._M_p = (pointer)paVar11;
  local_1a0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1a0,(ulong)&local_118);
  local_1a0.field_2._M_allocated_capacity = (size_type)local_118._M_dataplus._M_p;
  builtin_strncpy(local_1a0._M_dataplus._M_p,"field_number_name",0x11);
  local_1a0._M_string_length = (size_type)local_118._M_dataplus._M_p;
  local_1a0._M_dataplus._M_p[(long)local_118._M_dataplus._M_p] = '\0';
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1a0);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar11) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  local_208._M_dataplus._M_p = (pointer)paVar10;
  pcVar9 = FastInt32ToBufferLeft(*(int32 *)(descriptor + 0x44),paVar10->_M_local_buf);
  local_208._M_string_length = (size_type)(pcVar9 + -(long)paVar10);
  local_1d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,local_208._M_dataplus._M_p,
             (char *)(local_208._M_string_length + (long)local_208._M_dataplus._M_p));
  local_1a0.field_2._M_allocated_capacity = 0x756e5f646c656966;
  local_1a0._M_string_length = 0xc;
  local_1a0.field_2._8_5_ = 0x7265626d;
  local_1a0._M_dataplus._M_p = (pointer)paVar11;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1a0);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_1d8);
  pFVar14 = extraout_RDX_05;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar11) {
    operator_delete(local_1a0._M_dataplus._M_p);
    pFVar14 = extraout_RDX_06;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
    pFVar14 = extraout_RDX_07;
  }
  GetCapitalizedType_abi_cxx11_(&local_208,(objectivec *)descriptor,pFVar14);
  local_1d8.field_2._M_allocated_capacity = 0x79745f646c656966;
  local_1d8._M_string_length = 10;
  local_1d8.field_2._8_3_ = 0x6570;
  local_1d8._M_dataplus._M_p = (pointer)paVar2;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1d8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  GetOptionalDeprecatedAttribute<google::protobuf::FieldDescriptor>
            (&local_208,descriptor,(FileDescriptor *)0x0,true,false);
  local_1a0._M_dataplus._M_p = (pointer)0x14;
  local_1d8._M_dataplus._M_p = (pointer)paVar2;
  local_1d8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1d8,(ulong)&local_1a0);
  local_1d8.field_2._M_allocated_capacity = (size_type)local_1a0._M_dataplus._M_p;
  *(undefined8 *)local_1d8._M_dataplus._M_p = 0x7461636572706564;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p + 8) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p + 9) = 'd';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p + 10) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p + 0xb) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p + 0xc) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p + 0xd) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p + 0xe) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p + 0xf) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p + 0x10) = 'b';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p + 0x11) = 'u';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p + 0x12) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p + 0x13) = 'e';
  local_1d8._M_string_length = (size_type)local_1a0._M_dataplus._M_p;
  local_1d8._M_dataplus._M_p[(long)local_1a0._M_dataplus._M_p] = '\0';
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1d8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar6 = *(int *)(descriptor + 0x3c);
  if (iVar6 == 3) {
    local_1d8._M_dataplus._M_p = (pointer)0x10;
    local_208._M_dataplus._M_p = (pointer)paVar10;
    local_208._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_1d8);
    local_208.field_2._M_allocated_capacity._0_4_ = SUB84(local_1d8._M_dataplus._M_p,0);
    local_208.field_2._M_local_buf[4] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x20);
    local_208.field_2._M_local_buf[5] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x28);
    local_208.field_2._M_allocated_capacity._6_2_ =
         (undefined2)((ulong)local_1d8._M_dataplus._M_p >> 0x30);
    *(undefined8 *)local_208._M_dataplus._M_p = 0x646c656946425047;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 8) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 9) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 10) = 'p';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xb) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xc) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xd) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xe) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xf) = 'd';
    local_208._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
    local_208._M_dataplus._M_p[(long)local_1d8._M_dataplus._M_p] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
               &local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar10) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    iVar6 = *(int *)(descriptor + 0x3c);
  }
  if (iVar6 == 2) {
    local_1d8._M_dataplus._M_p = (pointer)0x10;
    local_208._M_dataplus._M_p = (pointer)paVar10;
    local_208._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_1d8);
    local_208.field_2._M_allocated_capacity._0_4_ = SUB84(local_1d8._M_dataplus._M_p,0);
    local_208.field_2._M_local_buf[4] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x20);
    local_208.field_2._M_local_buf[5] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x28);
    local_208.field_2._M_allocated_capacity._6_2_ =
         (undefined2)((ulong)local_1d8._M_dataplus._M_p >> 0x30);
    *(undefined8 *)local_208._M_dataplus._M_p = 0x646c656946425047;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 8) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 9) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 10) = 'q';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xb) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xc) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xd) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xe) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xf) = 'd';
    local_208._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
    local_208._M_dataplus._M_p[(long)local_1d8._M_dataplus._M_p] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
               &local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar10) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    iVar6 = *(int *)(descriptor + 0x3c);
  }
  if (iVar6 == 1) {
    local_1d8._M_dataplus._M_p = (pointer)0x10;
    local_208._M_dataplus._M_p = (pointer)paVar10;
    local_208._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_1d8);
    local_208.field_2._M_allocated_capacity._0_4_ = SUB84(local_1d8._M_dataplus._M_p,0);
    local_208.field_2._M_local_buf[4] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x20);
    local_208.field_2._M_local_buf[5] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x28);
    local_208.field_2._M_allocated_capacity._6_2_ =
         (undefined2)((ulong)local_1d8._M_dataplus._M_p >> 0x30);
    *(undefined8 *)local_208._M_dataplus._M_p = 0x646c656946425047;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 8) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 9) = 'p';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 10) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xb) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xc) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xd) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xe) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xf) = 'l';
    local_208._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
    local_208._M_dataplus._M_p[(long)local_1d8._M_dataplus._M_p] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
               &local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar10) {
      operator_delete(local_208._M_dataplus._M_p);
    }
  }
  bVar5 = FieldDescriptor::is_packed(descriptor);
  if (bVar5) {
    local_208.field_2._M_allocated_capacity._0_4_ = 0x46425047;
    local_208.field_2._M_local_buf[4] = 'i';
    local_208.field_2._M_local_buf[5] = 'e';
    local_208.field_2._M_allocated_capacity._6_2_ = 0x646c;
    local_208.field_2._M_local_buf[8] = 'P';
    local_208.field_2._M_local_buf[9] = 'a';
    local_208.field_2._10_4_ = 0x64656b63;
    local_208._M_string_length = 0xe;
    local_208.field_2._M_local_buf[0xe] = '\0';
    local_208._M_dataplus._M_p = (pointer)paVar10;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
               &local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar10) {
      operator_delete(local_208._M_dataplus._M_p);
    }
  }
  if (descriptor[0x40] == (FieldDescriptor)0x1) {
    local_1d8._M_dataplus._M_p = (pointer)0x17;
    local_208._M_dataplus._M_p = (pointer)paVar10;
    local_208._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_1d8);
    local_208.field_2._M_allocated_capacity._0_4_ = SUB84(local_1d8._M_dataplus._M_p,0);
    local_208.field_2._M_local_buf[4] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x20);
    local_208.field_2._M_local_buf[5] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x28);
    local_208.field_2._M_allocated_capacity._6_2_ =
         (undefined2)((ulong)local_1d8._M_dataplus._M_p >> 0x30);
    *(undefined8 *)local_208._M_dataplus._M_p = 0x646c656946425047;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 8) = 'H';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 9) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xb) = 'D';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xc) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xd) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xe) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xf) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xf) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x10) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x11) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x12) = 'V';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x13) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x14) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x15) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x16) = 'e';
    local_208._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
    local_208._M_dataplus._M_p[(long)local_1d8._M_dataplus._M_p] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
               &local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar10) {
      operator_delete(local_208._M_dataplus._M_p);
    }
  }
  if (bVar15) {
    local_1d8._M_dataplus._M_p = (pointer)0x1c;
    local_208._M_dataplus._M_p = (pointer)paVar10;
    local_208._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_1d8);
    local_208.field_2._M_allocated_capacity._0_4_ = SUB84(local_1d8._M_dataplus._M_p,0);
    local_208.field_2._M_local_buf[4] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x20);
    local_208.field_2._M_local_buf[5] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x28);
    local_208.field_2._M_allocated_capacity._6_2_ =
         (undefined2)((ulong)local_1d8._M_dataplus._M_p >> 0x30);
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xc) = 'F';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xd) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xe) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xf) = 'm';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x10) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x11) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x12) = 'N';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x13) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x14) = 'm';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x15) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x16) = 'C';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x17) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x18) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x19) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x1a) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x1b) = 'm';
    *(undefined8 *)local_208._M_dataplus._M_p = 0x646c656946425047;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 8) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 9) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 10) = 'x';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xb) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xc) = 'F';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xd) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xe) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xf) = 'm';
    local_208._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
    local_208._M_dataplus._M_p[(long)local_1d8._M_dataplus._M_p] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
               &local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar10) {
      operator_delete(local_208._M_dataplus._M_p);
    }
  }
  if (*(once_flag **)(descriptor + 0x30) != (once_flag *)0x0) {
    local_208._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_1d8._M_dataplus._M_p = (pointer)descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x30),(_func_void_FieldDescriptor_ptr **)&local_208,
               (FieldDescriptor **)&local_1d8);
  }
  if (*(int *)(descriptor + 0x38) == 0xe) {
    local_1d8._M_dataplus._M_p = (pointer)0x19;
    local_208._M_dataplus._M_p = (pointer)paVar10;
    local_208._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_1d8);
    local_208.field_2._M_allocated_capacity._0_4_ = SUB84(local_1d8._M_dataplus._M_p,0);
    local_208.field_2._M_local_buf[4] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x20);
    local_208.field_2._M_local_buf[5] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x28);
    local_208.field_2._M_allocated_capacity._6_2_ =
         (undefined2)((ulong)local_1d8._M_dataplus._M_p >> 0x30);
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 9) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xb) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xc) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xd) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xe) = 'm';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xf) = 'D';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x10) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x11) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x12) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x13) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x14) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x15) = 'p';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x16) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x17) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0x18) = 'r';
    *(undefined8 *)local_208._M_dataplus._M_p = 0x646c656946425047;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 8) = 'H';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 9) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xb) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xc) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xd) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xe) = 'm';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p + 0xf) = 'D';
    local_208._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
    local_208._M_dataplus._M_p[(long)local_1d8._M_dataplus._M_p] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
               &local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar10) {
      operator_delete(local_208._M_dataplus._M_p);
    }
  }
  BuildFlagsString(&local_208,FLAGTYPE_FIELD,&local_1b8);
  local_1d8.field_2._M_allocated_capacity = 0x616c66646c656966;
  local_1d8._M_string_length = 10;
  local_1d8.field_2._8_3_ = 0x7367;
  local_1d8._M_dataplus._M_p = (pointer)paVar2;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1d8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_208);
  pFVar14 = extraout_RDX_08;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
    pFVar14 = extraout_RDX_09;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
    pFVar14 = extraout_RDX_10;
  }
  DefaultValue_abi_cxx11_(&local_208,(objectivec *)descriptor,pFVar14);
  local_1d8._M_string_length = 7;
  local_1d8.field_2._M_allocated_capacity = 0x746c7561666564;
  local_1d8._M_dataplus._M_p = (pointer)paVar2;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1d8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_208);
  pFVar14 = extraout_RDX_11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
    pFVar14 = extraout_RDX_12;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
    pFVar14 = extraout_RDX_13;
  }
  GPBGenericValueFieldName_abi_cxx11_(&local_208,(objectivec *)descriptor,pFVar14);
  local_1d8.field_2._M_allocated_capacity = 0x5f746c7561666564;
  local_1d8._M_string_length = 0xc;
  local_1d8.field_2._8_5_ = 0x656d616e;
  local_1d8._M_dataplus._M_p = (pointer)paVar2;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1d8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  local_1d8._M_dataplus._M_p = (pointer)0x15;
  local_208._M_dataplus._M_p = (pointer)paVar10;
  local_208._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_1d8);
  local_208.field_2._M_allocated_capacity._0_4_ = SUB84(local_1d8._M_dataplus._M_p,0);
  local_208.field_2._M_local_buf[4] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x20);
  local_208.field_2._M_local_buf[5] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x28);
  local_208.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_1d8._M_dataplus._M_p >> 0x30);
  *(undefined8 *)local_208._M_dataplus._M_p = 0x6570795461746164;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 8) = 'S';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 9) = 'p';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 10) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xb) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xc) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xd) = 'f';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xe) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xf) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xd) = 'f';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xe) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xf) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x10) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x11) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x12) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x13) = 'm';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x14) = 'e';
  local_208._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
  local_208._M_dataplus._M_p[(long)local_1d8._M_dataplus._M_p] = '\0';
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_208);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x39e157);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  local_1d8._M_dataplus._M_p = (pointer)0x16;
  local_208._M_dataplus._M_p = (pointer)paVar10;
  local_208._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_1d8);
  local_208.field_2._M_allocated_capacity._0_4_ = SUB84(local_1d8._M_dataplus._M_p,0);
  local_208.field_2._M_local_buf[4] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x20);
  local_208.field_2._M_local_buf[5] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x28);
  local_208.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_1d8._M_dataplus._M_p >> 0x30);
  *(undefined8 *)local_208._M_dataplus._M_p = 0x6570795461746164;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 8) = 'S';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 9) = 'p';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 10) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xb) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xc) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xd) = 'f';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xe) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xf) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xe) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xf) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x10) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x11) = 'v';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x12) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x13) = 'l';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x14) = 'u';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x15) = 'e';
  local_208._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
  local_208._M_dataplus._M_p[(long)local_1d8._M_dataplus._M_p] = '\0';
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_208);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x39256d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  std::operator+(&local_118,"(uint32_t)offsetof(",&local_180);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1a0.field_2._M_allocated_capacity = *psVar12;
    local_1a0.field_2._8_8_ = plVar8[3];
    local_1a0._M_dataplus._M_p = (pointer)paVar11;
  }
  else {
    local_1a0.field_2._M_allocated_capacity = *psVar12;
    local_1a0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_1a0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1a0,(ulong)local_138._M_dataplus._M_p);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar13) {
    local_1d8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1d8.field_2._8_8_ = plVar8[3];
    local_1d8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1d8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_1d8._M_string_length = plVar8[1];
  *plVar8 = (long)paVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar13) {
    sVar3 = paVar13->_M_allocated_capacity;
    lVar4 = plVar8[3];
    local_208.field_2._M_allocated_capacity._0_4_ = (undefined4)sVar3;
    local_208.field_2._M_local_buf[4] = (char)(sVar3 >> 0x20);
    local_208.field_2._M_local_buf[5] = (char)(sVar3 >> 0x28);
    local_208.field_2._M_allocated_capacity._6_2_ = (undefined2)(sVar3 >> 0x30);
    local_208.field_2._M_local_buf[8] = (char)lVar4;
    local_208.field_2._M_local_buf[9] = (char)((ulong)lVar4 >> 8);
    local_208.field_2._10_4_ = (undefined4)((ulong)lVar4 >> 0x10);
    local_208.field_2._M_local_buf[0xe] = (char)((ulong)lVar4 >> 0x30);
    local_208.field_2._M_local_buf[0xf] = (char)((ulong)lVar4 >> 0x38);
    local_208._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    sVar3 = paVar13->_M_allocated_capacity;
    local_208.field_2._M_allocated_capacity._0_4_ = (undefined4)sVar3;
    local_208.field_2._M_local_buf[4] = (char)(sVar3 >> 0x20);
    local_208.field_2._M_local_buf[5] = (char)(sVar3 >> 0x28);
    local_208.field_2._M_allocated_capacity._6_2_ = (undefined2)(sVar3 >> 0x30);
    local_208._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_208._M_string_length = plVar8[1];
  *plVar8 = (long)paVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_140 = 0x14;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d8,(ulong)&local_140);
  local_d8.field_2._M_allocated_capacity = local_140;
  builtin_strncpy(local_d8._M_dataplus._M_p,"storage_offset_value",0x14);
  local_d8._M_string_length = local_140;
  local_d8._M_dataplus._M_p[local_140] = '\0';
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_d8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar11) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  local_1d8._M_dataplus._M_p = (pointer)0x16;
  local_208._M_dataplus._M_p = (pointer)paVar10;
  local_208._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_1d8);
  local_208.field_2._M_allocated_capacity._0_4_ = SUB84(local_1d8._M_dataplus._M_p,0);
  local_208.field_2._M_local_buf[4] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x20);
  local_208.field_2._M_local_buf[5] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x28);
  local_208.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_1d8._M_dataplus._M_p >> 0x30);
  *(undefined8 *)local_208._M_dataplus._M_p = 0x5f656761726f7473;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 8) = 'o';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 9) = 'f';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 10) = 'f';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xb) = 's';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xc) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xd) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xe) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xf) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xe) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xf) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x10) = 'o';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x11) = 'm';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x12) = 'm';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x13) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x14) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0x15) = 't';
  local_208._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
  local_208._M_dataplus._M_p[(long)local_1d8._M_dataplus._M_p] = '\0';
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_208);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x38f545);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  local_1d8._M_dataplus._M_p = (pointer)0x11;
  local_208._M_dataplus._M_p = (pointer)paVar10;
  local_208._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_1d8);
  local_208.field_2._M_allocated_capacity._0_4_ = SUB84(local_1d8._M_dataplus._M_p,0);
  local_208.field_2._M_local_buf[4] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x20);
  local_208.field_2._M_local_buf[5] = (char)((ulong)local_1d8._M_dataplus._M_p >> 0x28);
  local_208.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_1d8._M_dataplus._M_p >> 0x30);
  *(undefined8 *)local_208._M_dataplus._M_p = 0x5f656761726f7473;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 8) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 9) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 10) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xb) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xc) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xd) = 'b';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xe) = 'u';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p + 0xf) = 't';
  local_208._M_dataplus._M_p[0x10] = 'e';
  local_208._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
  local_208._M_dataplus._M_p[(long)local_1d8._M_dataplus._M_p] = '\0';
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_208);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x38f545);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar10) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&((SourceLocation *)local_98)->leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&((SourceLocation *)local_98)->trailing_comments + 0x10U)) {
    operator_delete(local_68._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&((SourceLocation *)local_98)->leading_comments + 0x10U)) {
    operator_delete(local_88._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_160 != local_150) {
    operator_delete(local_160);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  return;
}

Assistant:

FieldGenerator::FieldGenerator(const FieldDescriptor* descriptor,
                               const Options& options)
    : descriptor_(descriptor) {
  SetCommonFieldVariables(descriptor, &variables_);
}